

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

void Q_SetName(QMatrix *Q,char *Name)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *__dest;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return;
  }
  free(Q->Name);
  sVar2 = strlen(Name);
  __dest = (char *)malloc(sVar2 + 1);
  Q->Name = __dest;
  if (__dest != (char *)0x0) {
    strcpy(__dest,Name);
    return;
  }
  LASError(LASMemAllocErr,"Q_SetName",Name,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void Q_SetName(QMatrix *Q, char *Name)
/* (re)set name of the matrix Q */
{
    if (LASResult() == LASOK) {
        free(Q->Name);
        Q->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
        if (Q->Name != NULL)
            strcpy(Q->Name, Name);
        else
            LASError(LASMemAllocErr, "Q_SetName", Name, NULL, NULL);
    }
}